

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recycled.hpp
# Opt level: O0

void __thiscall
Lib::
MaybeAlive<Lib::Stack<std::unique_ptr<Indexing::TermCodeTree<Indexing::DemodulatorData>::TermMatcher,_std::default_delete<Indexing::TermCodeTree<Indexing::DemodulatorData>::TermMatcher>_>_>_>
::~MaybeAlive(MaybeAlive<Lib::Stack<std::unique_ptr<Indexing::TermCodeTree<Indexing::DemodulatorData>::TermMatcher,_std::default_delete<Indexing::TermCodeTree<Indexing::DemodulatorData>::TermMatcher>_>_>_>
              *this)

{
  long in_RDI;
  
  **(undefined1 **)(in_RDI + 0x20) = 0;
  Stack<std::unique_ptr<Indexing::TermCodeTree<Indexing::DemodulatorData>::TermMatcher,_std::default_delete<Indexing::TermCodeTree<Indexing::DemodulatorData>::TermMatcher>_>_>
  ::~Stack(&this->_self);
  return;
}

Assistant:

~MaybeAlive() { *_alive = false; }